

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
::positive_negative_transpose
          (Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
           *this,ID_index pivot1,ID_index pivot2)

{
  Pos_index simplexIndex;
  Pos_index simplexIndex_00;
  Pos_index *pPVar1;
  reference __a;
  reference __b;
  Pos_index pos2;
  Pos_index pos1;
  ID_index pivot2_local;
  ID_index pivot1_local;
  Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
  *this_local;
  
  simplexIndex = _get_pivot_position(this,pivot1);
  simplexIndex_00 = _get_pivot_position(this,pivot2);
  pPVar1 = _birth(this,simplexIndex);
  *pPVar1 = simplexIndex_00;
  pPVar1 = _death(this,simplexIndex_00);
  *pPVar1 = simplexIndex;
  __a = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  (&(this->
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
                    ).indexToBar_,(ulong)simplexIndex);
  __b = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  (&(this->
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
                    ).indexToBar_,(ulong)simplexIndex_00);
  std::swap<unsigned_int>(__a,__b);
  return;
}

Assistant:

void positive_negative_transpose(ID_index pivot1, ID_index pivot2) {
    Pos_index pos1 = _get_pivot_position(pivot1);
    Pos_index pos2 = _get_pivot_position(pivot2);

    _birth(pos1) = pos2;
    _death(pos2) = pos1;
    std::swap(CP::indexToBar_.at(pos1), CP::indexToBar_.at(pos2));
  }